

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy.cpp
# Opt level: O0

json read_json_from_file(path *path)

{
  undefined8 uVar1;
  json_value extraout_RDX;
  path *in_RSI;
  json jVar2;
  long local_220;
  ifstream config_file;
  path *path_local;
  json *config;
  
  std::ifstream::ifstream(&local_220);
  uVar1 = *(undefined8 *)(local_220 + -0x18);
  std::operator|(_S_badbit,_S_failbit);
  std::ios::exceptions((int)&local_220 + (int)uVar1);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)&local_220,in_RSI,_S_in);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)path,(nullptr_t)0x0);
  nlohmann::operator>>
            ((istream *)&local_220,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)path);
  std::ifstream::~ifstream(&local_220);
  jVar2.m_value.object = extraout_RDX.object;
  jVar2._0_8_ = path;
  return jVar2;
}

Assistant:

json read_json_from_file(const std::filesystem::path& path)
{
    std::ifstream config_file;
    config_file.exceptions(std::ios::badbit | std::ios::failbit);
    config_file.open(path);
    json config;
    config_file >> config;
    return config;
}